

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O2

void print_measurement(CDashMemo *memo,char *message,__va_list_tag *arguments)

{
  (*memo->printer)(memo->stream,"       <Measurement>\n        <Value>");
  if (message == (char *)0x0) {
    (*memo->printer)(memo->stream,"Problem");
  }
  else {
    (*memo->vprinter)(memo->stream,message,arguments);
  }
  (*memo->printer)(memo->stream,"</Value>\n       </Measurement>\n");
  return;
}

Assistant:

static void print_measurement(CDashMemo *memo, const char* message, va_list arguments) {
    memo->printer(memo->stream,
                  "       <Measurement>\n"
                  "        <Value>");
    if (message == NULL) {
        memo->printer(memo->stream,
                      "Problem");
    } else {
        memo->vprinter(memo->stream,
                       message, arguments);
    }
    memo->printer(memo->stream,
                  "</Value>\n"
                  "       </Measurement>\n");
}